

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O2

int anon_unknown.dwarf_232db::Choose(int n)

{
  int *piVar1;
  __pid_t _Var2;
  int iVar3;
  int iVar4;
  uint __seed;
  undefined8 extraout_RAX;
  int __val;
  char *pcVar5;
  long lVar6;
  int __val_00;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (n < 1) {
LAB_002675ca:
    die("n > 0 failed at line __LINE__");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    _Unwind_Resume(extraout_RAX);
  }
  __val_00 = n + -1;
  __val = 0;
  do {
    if (__val == __val_00) {
      std::__cxx11::to_string(&local_70,__val_00);
      std::operator+(&local_50,&local_70," ");
      std::__cxx11::string::append((string *)(anonymous_namespace)::Choices_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      return __val_00;
    }
    pcVar5 = (char *)(anonymous_namespace)::Shmem;
    if ((char)(anonymous_namespace)::Shmem[0x292] == '\x01') {
LAB_0026756f:
      pthread_mutex_unlock((pthread_mutex_t *)((long)pcVar5 + 8));
      exit(-1);
    }
    _Var2 = fork();
    iVar4 = (anonymous_namespace)::Depth;
    if (_Var2 == 0) {
      LOCK();
      (anonymous_namespace)::Id = *(anonymous_namespace)::Shmem;
      *(anonymous_namespace)::Shmem = *(anonymous_namespace)::Shmem + 1;
      UNLOCK();
      std::__cxx11::to_string(&local_70,__val);
      std::operator+(&local_50,&local_70," ");
      std::__cxx11::string::append((string *)(anonymous_namespace)::Choices_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      (anonymous_namespace)::Depth = (anonymous_namespace)::Depth + 1;
      __seed = getpid();
      srand(__seed);
      return __val;
    }
    if (_Var2 == -1) {
LAB_002675a6:
      die("fork failed");
LAB_002675b2:
      die("Shmem->Running <= Cores failed at line __LINE__");
LAB_002675be:
      die("unlock failed");
      goto LAB_002675ca;
    }
    lVar6 = (long)(anonymous_namespace)::Depth;
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)((anonymous_namespace)::Shmem + 1));
    if (iVar3 != 0) {
LAB_0026759a:
      die("lock failed");
      goto LAB_002675a6;
    }
    if (99 < iVar4) {
      die("oops, you\'ll need to rebuild opt-fuzz with a larger MAX_DEPTH");
      goto LAB_0026759a;
    }
    if ((int)(anonymous_namespace)::Cores._128_4_ <
        *(int *)((long)(anonymous_namespace)::Shmem + 0x148c)) goto LAB_002675b2;
    while (pcVar5 = (char *)(anonymous_namespace)::Shmem,
          (int)(anonymous_namespace)::Cores._128_4_ <=
          *(int *)((long)(anonymous_namespace)::Shmem + 0x148c)) {
      piVar1 = (int *)((long)(anonymous_namespace)::Shmem + lVar6 * 4 + 0x12f8);
      *piVar1 = *piVar1 + 1;
      if ((char)*(long *)((long)pcVar5 + 0x1490) == '\x01') goto LAB_0026756f;
      iVar4 = pthread_cond_wait((pthread_cond_t *)((long)pcVar5 + (lVar6 * 6 + 7) * 8),
                                (pthread_mutex_t *)((long)pcVar5 + 8));
      if (iVar4 != 0) {
        pcVar5 = "pthread_cond_wait failed";
        die("pthread_cond_wait failed");
        goto LAB_0026756f;
      }
      pcVar5 = (char *)(anonymous_namespace)::Shmem;
      if ((char)(anonymous_namespace)::Shmem[0x292] == '\x01') goto LAB_0026756f;
    }
    *(int *)((long)(anonymous_namespace)::Shmem + 0x148c) =
         *(int *)((long)(anonymous_namespace)::Shmem + 0x148c) + 1;
    iVar4 = pthread_mutex_unlock((pthread_mutex_t *)((long)pcVar5 + 8));
    if (iVar4 != 0) goto LAB_002675be;
    waitpid(-1,(int *)0x0,1);
    __val = __val + 1;
  } while( true );
}

Assistant:

int Choose(int n) {
  assert(n > 0);
  for (int i = 0; i < (n - 1); ++i) {
    if (Shmem->Stop) {
      pthread_mutex_unlock(&Shmem->Lock);
      exit(-1);
    }
    int ret = ::fork();
    if (ret == -1)
      die("fork failed");
    if (ret == 0) {
      // child
      Id = Shmem->NextId.fetch_add(1);
      Choices += std::to_string(i) + " ";
      ++Depth;
      ::srand(::getpid());
      return i;
    }
    // parent
    increase_runners(Depth);
    waitpid(-1, 0, WNOHANG);
  }
  Choices += std::to_string(n - 1) + " ";
  return n - 1;
}